

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int a;
  
  iVar7 = (this->_Path).Size;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    if (iVar7 == (this->_Path).Capacity) {
      if (iVar7 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar7 / 2 + iVar7;
      }
      iVar8 = iVar7 + 1;
      if (iVar7 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar8;
      iVar7 = (this->_Path).Size;
    }
    else {
      pIVar5 = (this->_Path).Data;
    }
    pIVar5[iVar7] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    iVar7 = (a_max_of_12 - a_min_of_12) + iVar7 + 1;
    if ((this->_Path).Capacity < iVar7) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar7;
    }
    iVar7 = (this->_Path).Size;
    do {
      IVar1 = *center;
      IVar2 = this->_Data->ArcFastVtx
              [(int)(a_min_of_12 +
                    (((uint)(a_min_of_12 / 6 + (a_min_of_12 >> 0x1f)) >> 1) - (a_min_of_12 >> 0x1f))
                    * -0xc)];
      if (iVar7 == (this->_Path).Capacity) {
        if (iVar7 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar7 / 2 + iVar7;
        }
        iVar8 = iVar7 + 1;
        if (iVar7 + 1 < iVar6) {
          iVar8 = iVar6;
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
        iVar7 = (this->_Path).Size;
      }
      else {
        pIVar5 = (this->_Path).Data;
      }
      IVar3.y = IVar2.y * radius + IVar1.y;
      IVar3.x = IVar2.x * radius + IVar1.x;
      pIVar5[iVar7] = IVar3;
      iVar7 = (this->_Path).Size + 1;
      (this->_Path).Size = iVar7;
      a_min_of_12 = a_min_of_12 + 1;
    } while (a_max_of_12 + 1 != a_min_of_12);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(center);
        return;
    }

    // For legacy reason the PathArcToFast() always takes angles where 2*PI is represented by 12,
    // but it is possible to set IM_DRAWLIST_ARCFAST_TESSELATION_MULTIPLIER to a higher value. This should compile to a no-op otherwise.
#if IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER != 1
    a_min_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
    a_max_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
#endif

    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->ArcFastVtx[a % IM_ARRAYSIZE(_Data->ArcFastVtx)];
        _Path.push_back(ImVec2(center.x + c.x * radius, center.y + c.y * radius));
    }
}